

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O0

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  bool bVar1;
  type_conflict5 tVar2;
  byte bVar3;
  Status SVar4;
  _Setprecision _Var5;
  char *__nptr;
  element_type *peVar6;
  undefined1 *puVar7;
  ostream *poVar8;
  ostream *r;
  ostream *poVar9;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  ostream *os;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objViolation;
  string reason;
  bool passedValidation;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff548;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff558;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff560;
  double in_stack_fffffffffffff580;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  char *in_stack_fffffffffffff598;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5d0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff5d8;
  ostream *in_stack_fffffffffffff5e0;
  undefined6 in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff65e;
  undefined1 in_stack_fffffffffffff65f;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff660;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff668;
  type_conflict5 local_96b;
  type_conflict5 local_969;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6d0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6d8;
  string local_918 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff700;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff708;
  undefined1 local_8e8 [56];
  undefined1 local_8b0 [72];
  undefined1 local_868 [56];
  undefined1 local_830 [72];
  undefined1 local_7e8 [56];
  undefined1 local_7b0 [72];
  undefined1 local_768 [56];
  undefined1 local_730 [56];
  undefined1 local_6f8 [56];
  undefined8 local_6c0;
  undefined1 local_6b8 [56];
  undefined1 local_680 [56];
  undefined8 local_648;
  Real local_640;
  Real local_638;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  undefined1 local_5f8 [56];
  undefined1 local_5c0 [56];
  double local_588;
  Real local_580;
  Real local_578;
  Verbosity local_56c;
  ostream *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_560;
  undefined8 local_528;
  undefined1 local_520 [56];
  undefined8 local_4e8;
  undefined1 local_4e0 [56];
  undefined8 local_4a8;
  undefined1 local_4a0 [56];
  undefined8 local_468;
  undefined1 local_460 [56];
  undefined8 local_428;
  undefined1 local_420 [56];
  undefined8 local_3e8;
  undefined1 local_3e0 [56];
  undefined8 local_3a8;
  undefined1 local_3a0 [56];
  undefined8 local_368;
  undefined1 local_360 [56];
  undefined8 local_328;
  undefined1 local_31c [75];
  allocator local_2d1;
  string local_2d0 [39];
  byte local_2a9;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  undefined8 local_298;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined8 *local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  long local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  double *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  double *local_78;
  Real *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  Real *local_60;
  Real *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_2a9 = 1;
  local_2a8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"",&local_2d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_328 = 0;
  local_288 = local_31c;
  local_290 = &local_328;
  local_298 = 0;
  local_a8 = local_290;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_368 = 0;
  local_270 = local_360;
  local_278 = &local_368;
  local_280 = 0;
  local_b0 = local_278;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_3a8 = 0;
  local_258 = local_3a0;
  local_260 = &local_3a8;
  local_268 = 0;
  local_b8 = local_260;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_3e8 = 0;
  local_240 = local_3e0;
  local_248 = &local_3e8;
  local_250 = 0;
  local_c0 = local_248;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_428 = 0;
  local_228 = local_420;
  local_230 = &local_428;
  local_238 = 0;
  local_c8 = local_230;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_468 = 0;
  local_210 = local_460;
  local_218 = &local_468;
  local_220 = 0;
  local_d0 = local_218;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_4a8 = 0;
  local_1f8 = local_4a0;
  local_200 = &local_4a8;
  local_208 = 0;
  local_d8 = local_200;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_4e8 = 0;
  local_1e0 = local_4e0;
  local_1e8 = &local_4e8;
  local_1f0 = 0;
  local_e0 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_528 = 0;
  local_1c8 = local_520;
  local_1d0 = &local_528;
  local_1d8 = 0;
  local_e8 = local_1d0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_1a8 = &local_560;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff550);
  local_56c = INFO1;
  local_568 = SPxOut::getStream(&local_2a8->spxout,&local_56c);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff550,(char *)in_stack_fffffffffffff548);
  if (bVar1) {
    local_578 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    local_50 = &local_560;
    local_58 = &local_578;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffff5d8,(double)in_stack_fffffffffffff5d0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff550,(char *)in_stack_fffffffffffff548);
    if (bVar1) {
      local_580 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_580 = -local_580;
      local_68 = &local_560;
      local_70 = &local_580;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffff5d8,(double)in_stack_fffffffffffff5d0);
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      local_588 = atof(__nptr);
      local_80 = &local_560;
      local_88 = &local_588;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffff5d8,(double)in_stack_fffffffffffff5d0);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal(in_stack_fffffffffffff588);
  local_30 = &local_560;
  local_38 = &local_630;
  local_28 = local_5f8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = local_5f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff550);
  local_10 = local_30;
  local_18 = local_38;
  local_8 = local_5f8;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548,
             (cpp_dec_float<50U,_int,_void> *)0x45ab72);
  spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffff548);
  local_f8 = local_31c;
  local_100 = local_5c0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
  SVar4 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  local_969 = false;
  if (SVar4 == INForUNBD) {
    local_638 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    tVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff548,(double *)0x45ac17);
    local_96b = true;
    if (!tVar2) {
      local_640 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_640 = -local_640;
      local_96b = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff548,(double *)0x45ac72);
    }
    local_969 = local_96b;
  }
  if (local_969 != false) {
    local_648 = 0;
    local_98 = local_31c;
    local_a0 = &local_648;
    local_90 = local_a0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffff5d8,(double)in_stack_fffffffffffff5d0);
  }
  local_198 = local_680;
  local_1a0 = local_31c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
  local_6c0 = 0;
  local_1b0 = local_6b8;
  local_1b8 = &local_6c0;
  local_1c0 = 0;
  local_f0 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff560,(double)in_stack_fffffffffffff558,in_stack_fffffffffffff550);
  local_190 = in_RDI + 0x28;
  local_188 = local_6f8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
  bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_2a9 = 0;
    std::__cxx11::string::operator+=(local_2d0,"Objective Violation; ");
  }
  SVar4 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  if (SVar4 == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT17(in_stack_fffffffffffff65f,
                                    CONCAT16(in_stack_fffffffffffff65e,in_stack_fffffffffffff658)));
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (in_stack_fffffffffffff708,in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(in_stack_fffffffffffff708,in_stack_fffffffffffff700,in_stack_fffffffffffff6f8
                      );
    local_178 = local_730;
    local_180 = local_360;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    local_170 = in_RDI + 0x28;
    local_168 = local_768;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff548);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45af65);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff590,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x45afbc);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Bound Violation; ");
    }
    local_158 = local_7b0;
    local_160 = local_3a0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    local_150 = in_RDI + 0x28;
    local_148 = local_7e8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff548);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45b0a7);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff590,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    bVar3 = bVar1 ^ 0xff;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x45b0fe);
    if ((bVar3 & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Row Violation; ");
    }
    local_138 = local_830;
    local_140 = local_3e0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    local_130 = in_RDI + 0x28;
    local_128 = local_868;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff548);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45b1e9);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff590,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x45b240);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Reduced Cost Violation; ");
    }
    local_118 = local_8b0;
    local_120 = local_420;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    local_110 = in_RDI + 0x28;
    local_108 = local_8e8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff550,(cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff548);
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45b32b);
    Tolerances::epsilon(peVar6);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff590,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x45b382);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Dual Violation; ");
    }
  }
  std::operator<<(local_568,"\n");
  std::operator<<(local_568,"Validation          :");
  if ((local_2a9 & 1) == 0) {
    std::__cxx11::string::length();
    puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
    poVar8 = local_568;
    *puVar7 = 0x5d;
    std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
    std::operator+(in_stack_fffffffffffff558,(char *)in_stack_fffffffffffff550);
    std::operator<<(poVar8,local_918);
    std::__cxx11::string::~string(local_918);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff6c8);
  }
  else {
    std::operator<<(local_568," Success\n");
  }
  poVar8 = std::operator<<(local_568,"   Objective        : ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar8,_Var5);
  poVar8 = boost::multiprecision::operator<<
                     (in_stack_fffffffffffff5e0,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)in_stack_fffffffffffff5d8);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(local_568,"   Bound            : ");
  r = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(r,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_568,"   Row              : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_568,"   Reduced Cost     : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar9 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
  std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(local_568,"   Dual             : ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::scientific);
  _Var5 = std::setprecision(8);
  std::operator<<(poVar9,_Var5);
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string(local_2d0);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}